

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O2

void __thiscall QTranslatorPrivate::clear(QTranslatorPrivate *this)

{
  char *__addr;
  QCoreApplication *receiver;
  bool bVar1;
  QEvent *this_00;
  QTranslator *unaff_RBX;
  
  __addr = this->unmapPointer;
  if ((__addr != (char *)0x0) && (this->unmapLength != 0)) {
    if ((this->field_0x78 & 1) == 0) {
      if ((this->resource)._M_t.super___uniq_ptr_impl<QResource,_std::default_delete<QResource>_>.
          _M_t.super__Tuple_impl<0UL,_QResource_*,_std::default_delete<QResource>_>.
          super__Head_base<0UL,_QResource_*,_false>._M_head_impl == (QResource *)0x0) {
        operator_delete__(__addr);
      }
    }
    else {
      this->field_0x78 = this->field_0x78 & 0xfe;
      munmap(__addr,this->unmapLength);
    }
  }
  std::__uniq_ptr_impl<QResource,_std::default_delete<QResource>_>::reset
            ((__uniq_ptr_impl<QResource,_std::default_delete<QResource>_> *)&this->resource,
             (pointer)0x0);
  this->unmapPointer = (char *)0x0;
  this->unmapLength = 0;
  this->messageLength = 0;
  this->offsetLength = 0;
  this->contextLength = 0;
  this->numerusRulesLength = 0;
  this->contextArray = (uchar *)0x0;
  this->numerusRulesArray = (uchar *)0x0;
  this->messageArray = (uchar *)0x0;
  this->offsetArray = (uchar *)0x0;
  std::
  vector<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
  ::clear(&this->subTranslators);
  QString::clear(&this->language);
  QString::clear(&this->filePath);
  bVar1 = QCoreApplicationPrivate::isTranslatorInstalled(unaff_RBX);
  receiver = QCoreApplication::self;
  if (bVar1) {
    this_00 = (QEvent *)operator_new(0x10);
    QEvent::QEvent(this_00,LanguageChange);
    QCoreApplication::postEvent(&receiver->super_QObject,this_00,0);
    return;
  }
  return;
}

Assistant:

void QTranslatorPrivate::clear()
{
    Q_Q(QTranslator);
    if (unmapPointer && unmapLength) {
#if defined(QT_USE_MMAP)
        if (used_mmap) {
            used_mmap = false;
            munmap(unmapPointer, unmapLength);
        } else
#endif
        if (!resource)
            delete [] unmapPointer;
    }

    resource = nullptr;
    unmapPointer = nullptr;
    unmapLength = 0;
    messageArray = nullptr;
    contextArray = nullptr;
    offsetArray = nullptr;
    numerusRulesArray = nullptr;
    messageLength = 0;
    contextLength = 0;
    offsetLength = 0;
    numerusRulesLength = 0;

    subTranslators.clear();

    language.clear();
    filePath.clear();

    if (QCoreApplicationPrivate::isTranslatorInstalled(q))
        QCoreApplication::postEvent(QCoreApplication::instance(),
                                    new QEvent(QEvent::LanguageChange));
}